

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

size_t sx_os_processmem(void)

{
  long lVar1;
  int iVar2;
  long lVar3;
  FILE *local_30;
  long lStack_20;
  int items;
  long pages;
  FILE *file;
  
  pages = (long)fopen("/proc/self/statm","r");
  if ((FILE *)pages == (FILE *)0x0) {
    file = (FILE *)0x0;
  }
  else {
    lStack_20 = 0;
    iVar2 = __isoc99_fscanf(pages,"%*s%ld",&stack0xffffffffffffffe0);
    fclose((FILE *)pages);
    lVar1 = lStack_20;
    if (iVar2 == 1) {
      lVar3 = sysconf(0x1e);
      local_30 = (FILE *)(lVar1 * lVar3);
    }
    else {
      local_30 = (FILE *)0x0;
    }
    file = local_30;
  }
  return (size_t)file;
}

Assistant:

size_t sx_os_processmem(void)
{
#if SX_PLATFORM_ANDROID
    struct mallinfo mi = mallinfo();
    return mi.uordblks;
#elif SX_PLATFORM_LINUX || SX_PLATFORM_HURD
    FILE* file = fopen("/proc/self/statm", "r");
    if (NULL == file) {
        return 0;
    }

    long pages = 0;
    int items = fscanf(file, "%*s%ld", &pages);
    fclose(file);
    return 1 == items ? pages * sysconf(_SC_PAGESIZE) : 0;
#elif SX_PLATFORM_OSX
#    if defined(MACH_TASK_BASIC_INFO)
    struct mach_task_basic_info info;
    mach_msg_type_number_t infoCount = MACH_TASK_BASIC_INFO_COUNT;

    int const result =
        task_info(mach_task_self(), MACH_TASK_BASIC_INFO, (task_info_t)&info, &infoCount);
#    else
    task_basic_info info;
    mach_msg_type_number_t infoCount = TASK_BASIC_INFO_COUNT;

    int const result = task_info(mach_task_self(), TASK_BASIC_INFO, (task_info_t)&info, &infoCount);
#    endif    // defined(MACH_TASK_BASIC_INFO)
    if (KERN_SUCCESS != result) {
        return 0;
    }

    return info.resident_size;
#elif SX_PLATFORM_WINDOWS
    PROCESS_MEMORY_COUNTERS pmc;
    GetProcessMemoryInfo(GetCurrentProcess(), &pmc, sizeof(pmc));
    return pmc.WorkingSetSize;
#else
    return 0;
#endif    // SX_PLATFORM_*
}